

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

boolean_validator __thiscall goodform::sub_form::boolean(sub_form *this)

{
  bool bVar1;
  undefined1 uVar2;
  bool *pbVar3;
  string local_58;
  error_message local_38;
  
  bVar1 = is<bool>(this->variant_);
  if (!bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"TYPE NOT BOOLEAN","");
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)this->error_,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.message_._M_dataplus._M_p != &local_38.message_.field_2) {
      operator_delete(local_38.message_._M_dataplus._M_p,
                      local_38.message_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = is<bool>(this->variant_);
  if (bVar1) {
    pbVar3 = get<bool>(this->variant_);
    uVar2 = *pbVar3;
  }
  else {
    uVar2 = 0;
  }
  return (boolean_validator)(bool)uVar2;
}

Assistant:

boolean_validator sub_form::boolean()
  {
    if (!is<bool>(this->variant_))
      this->error_ = error_message("TYPE NOT BOOLEAN");

    boolean_validator ret(is<bool>(this->variant_) ? get<bool>(this->variant_) : false);
    return ret;
  }